

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

int __thiscall
MeCab::DecoderFeatureIndex::open(DecoderFeatureIndex *this,char *__file,int __oflag,...)

{
  bool bVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string modelfile;
  die local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Param::get<std::__cxx11::string>(&local_40,(Param *)__file,"model");
  bVar1 = openBinaryModel(this,(Param *)__file);
  if (!bVar1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," is not a binary model. reopen it as text mode...",0x31);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = openTextModel(this,(Param *)__file);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"openTextModel(param)",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"no such file or directory: ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
      if (!bVar1) {
        die::~die(&local_41);
      }
    }
  }
  FeatureIndex::openTemplate(&this->super_FeatureIndex,(Param *)__file);
  paVar3 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
    paVar3 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)paVar3 >> 8),1);
}

Assistant:

bool DecoderFeatureIndex::open(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  // open the file as binary mode again and fallback to text file
  if (!openBinaryModel(param)) {
    std::cout << modelfile
              << " is not a binary model. reopen it as text mode..."
              << std::endl;
    CHECK_DIE(openTextModel(param)) <<
        "no such file or directory: " << modelfile;
  }

  if (!openTemplate(param)) {
    close();
    return false;
  }

  return true;
}